

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-birth.c
# Opt level: O0

_Bool sell_stat(wchar_t choice,int *stats_local,int *points_spent_local,int *points_inc_local,
               int *points_left_local,_Bool update_display)

{
  int iVar1;
  wchar_t stat_cost;
  _Bool update_display_local;
  int *points_left_local_local;
  int *points_inc_local_local;
  int *points_spent_local_local;
  int *stats_local_local;
  wchar_t choice_local;
  
  if (((choice < L'\x05') && (L'\xffffffff' < choice)) && (10 < stats_local[choice])) {
    iVar1 = birth_stat_costs[stats_local[choice]];
    stats_local[choice] = stats_local[choice] + -1;
    points_spent_local[choice] = points_spent_local[choice] - iVar1;
    points_inc_local[choice] = birth_stat_costs[stats_local[choice] + 1];
    *points_left_local = iVar1 + *points_left_local;
    if (update_display) {
      event_signal_birthpoints(points_spent_local,points_inc_local,*points_left_local);
      recalculate_stats(stats_local,*points_left_local);
    }
    stats_local_local._7_1_ = true;
  }
  else {
    stats_local_local._7_1_ = false;
  }
  return stats_local_local._7_1_;
}

Assistant:

static bool sell_stat(int choice, int stats_local[STAT_MAX],
	int points_spent_local[STAT_MAX],
	int points_inc_local[STAT_MAX],
	int *points_left_local, bool update_display)
{
	/* Must be a valid stat, and we can't "sell" stats below the base of 10. */
	if (!(choice >= STAT_MAX || choice < 0) && (stats_local[choice] > 10)) {
		int stat_cost = birth_stat_costs[stats_local[choice]];

		stats_local[choice]--;
		points_spent_local[choice] -= stat_cost;
		points_inc_local[choice] =
			birth_stat_costs[stats_local[choice] + 1];
		*points_left_local += stat_cost;

		if (update_display) {
			/* Tell the UI the new points situation. */
			event_signal_birthpoints(points_spent_local,
				points_inc_local, *points_left_local);

			/* Recalculate everything that's changed because
			   the stat has changed, and inform the UI. */
			recalculate_stats(stats_local, *points_left_local);
		}

		return true;
	}

	/* Didn't adjust stat. */
	return false;
}